

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::subject::SubjectFactoryTest_test_setting_nds_with_Tenors_Test::TestBody
          (SubjectFactoryTest_test_setting_nds_with_Tenors_Test *this)

{
  bool bVar1;
  string *psVar2;
  Tenor *pTVar3;
  undefined8 *puVar4;
  char *message;
  AssertionResult gtest_ar;
  SubjectFactory subject_factory;
  AssertHelper local_138 [2];
  undefined1 local_128 [16];
  internal local_118 [8];
  _Alloc_hider local_110;
  long *local_108 [2];
  long local_f8 [2];
  long *local_e8 [2];
  long local_d8 [2];
  long *local_c8 [2];
  long local_b8 [2];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  undefined8 local_50;
  SubjectFactory local_48 [8];
  string local_40 [32];
  
  bidfx_public_api::price::subject::SubjectFactory::SubjectFactory(local_48,USER_INFO);
  bidfx_public_api::price::subject::SubjectFactory::Fx();
  local_50 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
  bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Nds();
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"CSFX","");
  psVar2 = (string *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Swap::LiquidityProvider(local_40);
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"USDCNY","");
  psVar2 = (string *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Swap::CurrencyPair(psVar2);
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"USD","");
  bidfx_public_api::price::subject::SubjectFactory::FX::Swap::Currency(psVar2);
  pTVar3 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Swap::NearQuantity
                              (1000000.0);
  bidfx_public_api::price::subject::SubjectFactory::FX::Swap::NearTenor(pTVar3);
  pTVar3 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Swap::FarQuantity
                              (850000.0);
  puVar4 = (undefined8 *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Swap::FarTenor(pTVar3);
  (**(code **)*puVar4)(&local_68,puVar4);
  bidfx_public_api::price::subject::Subject::ToString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_118,
             "\"AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=USD,DealType=NDS,FarCurrency=USD,FarQuantity=850000.00,FarTenor=3M,Level=1,LiquidityProvider=CSFX,Quantity=1000000.00,RequestFor=Stream,Symbol=USDCNY,Tenor=1M,User=fbennett\""
             ,
             "subject_factory.Fx().Stream().Nds() .LiquidityProvider(\"CSFX\") .CurrencyPair(\"USDCNY\") .Currency(\"USD\") .NearQuantity(1000000) .NearTenor(Tenor::IN_1_MONTH) .FarQuantity(850000) .FarTenor(Tenor::IN_3_MONTHS) .CreateSubject() .ToString().c_str()"
             ,
             "AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=USD,DealType=NDS,FarCurrency=USD,FarQuantity=850000.00,FarTenor=3M,Level=1,LiquidityProvider=CSFX,Quantity=1000000.00,RequestFor=Stream,Symbol=USDCNY,Tenor=1M,User=fbennett"
             ,(char *)local_138[0].data_);
  if (local_138[0].data_ != (AssertHelperData *)local_128) {
    operator_delete(local_138[0].data_,local_128._0_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  if (local_108[0] != local_f8) {
    operator_delete(local_108[0],local_f8[0] + 1);
  }
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0],local_d8[0] + 1);
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  local_a8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)__cxa_throw;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_110._M_p == (pointer)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_110._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_138,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subject/subject_factory_test.cpp"
               ,0x254,message);
    testing::internal::AssertHelper::operator=(local_138,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_138);
    if (local_a8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_a8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_a8.ptr_ + 8))();
      }
      local_a8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(SubjectFactoryTest, test_setting_nds_with_Tenors)
{
    SubjectFactory subject_factory = SubjectFactory(USER_INFO);

    ASSERT_STREQ(
            "AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=USD,DealType=NDS,FarCurrency=USD,FarQuantity=850000.00,FarTenor=3M,Level=1,LiquidityProvider=CSFX,Quantity=1000000.00,RequestFor=Stream,Symbol=USDCNY,Tenor=1M,User=fbennett",
            subject_factory.Fx().Stream().Nds()
                    .LiquidityProvider("CSFX")
                    .CurrencyPair("USDCNY")
                    .Currency("USD")
                    .NearQuantity(1000000)
                    .NearTenor(Tenor::IN_1_MONTH)
                    .FarQuantity(850000)
                    .FarTenor(Tenor::IN_3_MONTHS)
                    .CreateSubject()
                    .ToString().c_str());
}